

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Shared_Image.cxx
# Opt level: O1

void __thiscall Fl_Shared_Image::release(Fl_Shared_Image *this)

{
  int iVar1;
  size_t __n;
  long lVar2;
  
  iVar1 = this->refcount_;
  this->refcount_ = iVar1 + -1;
  if (iVar1 < 2) {
    if (0 < (long)num_images_) {
      __n = (long)(num_images_ + -1) << 3;
      lVar2 = 0;
      do {
        if (images_[lVar2] == this) {
          num_images_ = num_images_ + -1;
          if ((int)lVar2 < num_images_) {
            memmove(images_ + lVar2,images_ + lVar2 + 1,__n);
          }
          break;
        }
        lVar2 = lVar2 + 1;
        __n = __n - 8;
      } while (num_images_ != lVar2);
    }
    (*(this->super_Fl_Image)._vptr_Fl_Image[1])(this);
    if (images_ != (Fl_Shared_Image **)0x0 && num_images_ == 0) {
      operator_delete__(images_);
      images_ = (Fl_Shared_Image **)0x0;
      alloc_images_ = 0;
    }
  }
  return;
}

Assistant:

void Fl_Shared_Image::release() {
  int	i;	// Looping var...

  refcount_ --;
  if (refcount_ > 0) return;

  for (i = 0; i < num_images_; i ++)
    if (images_[i] == this) {
      num_images_ --;

      if (i < num_images_) {
        memmove(images_ + i, images_ + i + 1,
               (num_images_ - i) * sizeof(Fl_Shared_Image *));
      }

      break;
    }

  delete this;

  if (num_images_ == 0 && images_) {
    delete[] images_;

    images_       = 0;
    alloc_images_ = 0;
  }
}